

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O3

double dist_average_time<double,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::uniform_real_distribution<double>>
                 (uniform_real_distribution<double> *dist,
                 mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                 *generator,size_t trials,size_t times)

{
  long lVar1;
  size_t sVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  timer elapsed;
  timer local_38;
  
  if (trials == 0) {
    dVar5 = 0.0;
  }
  else {
    dVar5 = 0.0;
    sVar2 = trials;
    do {
      timer::timer(&local_38);
      dist_single_run<double,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::uniform_real_distribution<double>>
                (dist,generator,times);
      dVar3 = timer::elapsed(&local_38);
      sVar2 = sVar2 - 1;
      dVar5 = dVar5 + dVar3;
    } while (sVar2 != 0);
  }
  lVar1 = times * trials;
  auVar4._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar4._0_8_ = lVar1;
  auVar4._12_4_ = 0x45300000;
  return (((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 1e-06) / dVar5;
}

Assistant:

double dist_average_time(D& dist, G& generator, size_t trials, size_t times ) {
    double average_time = 0.0;

    for ( size_t i = 0; i < trials; ++i ) {
        timer elapsed;
        dist_single_run<Real>( dist, generator, times );
        average_time += elapsed.elapsed();
    }

    return trials * times / average_time / 1000000.0;
}